

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_color_hex_rgba(char *output,nk_color col)

{
  char cVar1;
  short sVar4;
  short sVar5;
  short sVar6;
  uint uVar7;
  byte bVar8;
  char cVar9;
  short sVar10;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  char cVar2;
  char cVar3;
  undefined4 uVar11;
  undefined6 uVar12;
  
  auVar14._12_4_ = (uint)col >> 8;
  auVar14._8_4_ = (uint)col >> 0xc;
  auVar14._4_4_ = col;
  auVar14._0_4_ = (uint)col >> 4;
  auVar14 = auVar14 & _DAT_00150030;
  auVar13._0_4_ = -(uint)(9 < auVar14._0_4_);
  auVar13._4_4_ = -(uint)(9 < auVar14._4_4_);
  auVar13._8_4_ = -(uint)(9 < auVar14._8_4_);
  auVar13._12_4_ = -(uint)(9 < auVar14._12_4_);
  auVar15._0_4_ = auVar14._0_4_ + 0x37;
  auVar15._4_4_ = auVar14._4_4_ + 0x37;
  auVar15._8_4_ = auVar14._8_4_ + 0x37;
  auVar15._12_4_ = auVar14._12_4_ + 0x37;
  auVar13 = ~auVar13 & (_DAT_00150050 | auVar14) | auVar15 & auVar13;
  sVar4 = auVar13._0_2_;
  cVar1 = (0 < sVar4) * (sVar4 < 0x100) * auVar13[0] - (0xff < sVar4);
  sVar4 = auVar13._2_2_;
  sVar10 = CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar13[2] - (0xff < sVar4),cVar1);
  sVar4 = auVar13._4_2_;
  cVar9 = (0 < sVar4) * (sVar4 < 0x100) * auVar13[4] - (0xff < sVar4);
  sVar4 = auVar13._6_2_;
  uVar11 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar13[6] - (0xff < sVar4),
                    CONCAT12(cVar9,sVar10));
  sVar4 = auVar13._8_2_;
  cVar2 = (0 < sVar4) * (sVar4 < 0x100) * auVar13[8] - (0xff < sVar4);
  sVar4 = auVar13._10_2_;
  uVar12 = CONCAT15((0 < sVar4) * (sVar4 < 0x100) * auVar13[10] - (0xff < sVar4),
                    CONCAT14(cVar2,uVar11));
  sVar4 = auVar13._12_2_;
  cVar3 = (0 < sVar4) * (sVar4 < 0x100) * auVar13[0xc] - (0xff < sVar4);
  sVar6 = auVar13._14_2_;
  sVar4 = (short)((uint)uVar11 >> 0x10);
  sVar5 = (short)((uint6)uVar12 >> 0x20);
  sVar6 = (short)(CONCAT17((0 < sVar6) * (sVar6 < 0x100) * auVar13[0xe] - (0xff < sVar6),
                           CONCAT16(cVar3,uVar12)) >> 0x30);
  *(uint *)output =
       CONCAT13((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                CONCAT12((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                         CONCAT11((0 < sVar4) * (sVar4 < 0x100) * cVar9 - (0xff < sVar4),
                                  (0 < sVar10) * (sVar10 < 0x100) * cVar1 - (0xff < sVar10))));
  uVar7 = (uint)col >> 0x14 & 0xf;
  cVar1 = (char)uVar7;
  cVar9 = cVar1 + '7';
  if (uVar7 < 10) {
    cVar9 = cVar1 + '0';
  }
  output[4] = cVar9;
  uVar7 = (uint)col >> 0x10 & 0xf;
  cVar1 = (char)uVar7;
  cVar9 = cVar1 + '7';
  if (uVar7 < 10) {
    cVar9 = cVar1 + '0';
  }
  bVar8 = (col.a >> 4) + 0x37;
  if ((uint)col < 0xa0000000) {
    bVar8 = col.a >> 4 | 0x30;
  }
  output[5] = cVar9;
  output[6] = bVar8;
  uVar7 = (uint)col >> 0x18 & 0xf;
  cVar1 = (char)uVar7;
  cVar9 = cVar1 + '7';
  if (uVar7 < 10) {
    cVar9 = cVar1 + '0';
  }
  output[7] = cVar9;
  output[8] = '\0';
  return;
}

Assistant:

NK_API void
nk_color_hex_rgba(char *output, struct nk_color col)
{
#define NK_TO_HEX(i) ((i) <= 9 ? '0' + (i): 'A' - 10 + (i))
output[0] = (char)NK_TO_HEX((col.r & 0xF0) >> 4);
output[1] = (char)NK_TO_HEX((col.r & 0x0F));
output[2] = (char)NK_TO_HEX((col.g & 0xF0) >> 4);
output[3] = (char)NK_TO_HEX((col.g & 0x0F));
output[4] = (char)NK_TO_HEX((col.b & 0xF0) >> 4);
output[5] = (char)NK_TO_HEX((col.b & 0x0F));
output[6] = (char)NK_TO_HEX((col.a & 0xF0) >> 4);
output[7] = (char)NK_TO_HEX((col.a & 0x0F));
output[8] = '\0';
#undef NK_TO_HEX
}